

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QDate __thiscall
QtPrivate::QCalendarDayValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  int extraout_var;
  qint64 qVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  
  local_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = param_3;
  QCalendar::partsFromDate((QDate)local_28);
  QCalendar::daysInMonth((int)(YearMonthDay *)local_28,extraout_var);
  qVar1 = QCalendar::dateFromParts((YearMonthDay *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28._8_8_) {
    __stack_chk_fail();
  }
  return (QDate)qVar1;
}

Assistant:

QDate QCalendarDayValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.day = qMin(qMax(1, m_day), cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}